

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O2

void __thiscall wasm::SCCs<IntIt,_GraphSCCs>::~SCCs(SCCs<IntIt,_GraphSCCs> *this)

{
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->elementInfo)._M_h);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  _Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
  ::~_Vector_base(&(this->workStack).
                   super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
                 );
  return;
}

Assistant:

SCCs(It inputIt, It inputEnd) : inputIt(inputIt), inputEnd(inputEnd) {}